

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

size_t meassure_ff(_func_void *addr)

{
  ulong uVar1;
  undefined8 in_RAX;
  ulong uVar2;
  uint64_t hi;
  uint64_t lo;
  uint64_t delta;
  uint64_t end;
  uint64_t start;
  _func_void *addr_local;
  
  uVar1 = rdtsc();
  uVar2 = uVar1 & 0xffffffff00000000 | CONCAT44((int)((ulong)in_RAX >> 0x20),(int)uVar1);
  clflush(*addr);
  uVar1 = rdtsc();
  return (uVar1 & 0xffffffff00000000 | CONCAT44((int)(uVar2 >> 0x20),(int)uVar1)) - uVar2;
}

Assistant:

size_t meassure_ff(void (* addr)(void))
{
    uint64_t start, end, delta;
    uint64_t lo, hi;
    asm volatile ("LFENCE");
    asm volatile ("RDTSC": "=a" (lo), "=d" (hi));
    start = (hi<<32) | lo;
    asm volatile ("LFENCE");

    asm volatile ("CLFLUSH 0(%0)\n":: "c" (addr): "rax");

    asm volatile ("MFENCE");
    asm volatile ("RDTSC": "=a" (lo), "=d" (hi));
    end = (hi<<32) | lo;
    asm volatile ("LFENCE");
    delta = end - start;
    return delta;

}